

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

WebAssemblyArrayBuffer *
Js::WebAssemblyArrayBuffer::Create(byte *buffer,uint32 length,DynamicType *type)

{
  Recycler *this;
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  Recycler *pRVar4;
  WebAssemblyArrayBuffer *this_00;
  undefined4 *puVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pSVar3 = Js::Type::GetScriptContext(&type->super_Type);
  this = pSVar3->recycler;
  if (buffer == (byte *)0x0) {
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_5dbadfc;
    data.filename._0_4_ = 0x41a;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_58);
    this_00 = (WebAssemblyArrayBuffer *)new<Memory::Recycler>(0x48,pRVar4,0x3a2aea);
    WebAssemblyArrayBuffer(this_00,length,type);
  }
  else {
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_5dbadfc;
    data.filename._0_4_ = 0x40e;
    pRVar4 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_58);
    this_00 = (WebAssemblyArrayBuffer *)new<Memory::Recycler>(0x48,pRVar4,0x3a2aea);
    WebAssemblyArrayBuffer(this_00,buffer,length,type);
  }
  Memory::Recycler::AddExternalMemoryUsage(this,(ulong)length);
  if (this_00 == (WebAssemblyArrayBuffer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x41f,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return this_00;
}

Assistant:

WebAssemblyArrayBuffer* WebAssemblyArrayBuffer::Create(byte* buffer, uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        WebAssemblyArrayBuffer* result = nullptr;
        if (buffer)
        {
            result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, buffer, length, type);
        }
        else
        {
#if ENABLE_FAST_ARRAYBUFFER
            if (CONFIG_FLAG(WasmFastArray))
            {
                result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, length, type, WasmVirtualAllocator);
            }
            else
#endif
            {
                result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, length, type);
            }
        }

        recycler->AddExternalMemoryUsage(length);
        Assert(result);
        return result;
    }